

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O0

bool __thiscall ViconDataStreamSDK::Core::VClient::IsEyeTrackerDevice(VClient *this,uint i_DeviceID)

{
  size_type sVar1;
  const_reference pvVar2;
  uint local_34;
  undefined1 local_30 [4];
  uint i;
  scoped_lock Lock;
  uint i_DeviceID_local;
  VClient *this_local;
  
  Lock._12_4_ = i_DeviceID;
  boost::unique_lock<boost::recursive_mutex>::unique_lock
            ((unique_lock<boost::recursive_mutex> *)local_30,&this->m_FrameMutex);
  local_34 = 0;
  do {
    sVar1 = std::
            vector<ViconCGStream::VEyeTrackerInfo,_std::allocator<ViconCGStream::VEyeTrackerInfo>_>
            ::size(&(this->m_LatestFrame).m_EyeTrackers);
    if (sVar1 <= local_34) {
      this_local._7_1_ = false;
LAB_0013b23b:
      boost::unique_lock<boost::recursive_mutex>::~unique_lock
                ((unique_lock<boost::recursive_mutex> *)local_30);
      return this_local._7_1_;
    }
    pvVar2 = std::
             vector<ViconCGStream::VEyeTrackerInfo,_std::allocator<ViconCGStream::VEyeTrackerInfo>_>
             ::operator[](&(this->m_LatestFrame).m_EyeTrackers,(ulong)local_34);
    if (pvVar2->m_DeviceID == Lock._12_4_) {
      this_local._7_1_ = true;
      goto LAB_0013b23b;
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

bool VClient::IsEyeTrackerDevice(unsigned int i_DeviceID) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );

  for( unsigned int i = 0; i < m_LatestFrame.m_EyeTrackers.size(); i++ )
  {
    if( m_LatestFrame.m_EyeTrackers[ i ].m_DeviceID == i_DeviceID )
    {
      return true;
    }
  }

  return false;
}